

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O2

int Amap_LibCreateMux(Amap_Lib_t *p,int iFan0,int iFan1,int iFan2)

{
  byte bVar1;
  Amap_Nod_t *pAVar2;
  Amap_Nod_t *pAVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Amap_Nod_t *pAVar11;
  
  pAVar11 = Amap_LibCreateObj(p);
  pAVar11->field_0x3 = 6;
  pAVar2 = p->pNodes;
  uVar4 = Abc_Lit2Var(iFan0);
  bVar1 = pAVar2[uVar4].field_0x2;
  pAVar2 = p->pNodes;
  uVar4 = Abc_Lit2Var(iFan1);
  pAVar3 = p->pNodes;
  iVar6 = *(int *)(pAVar2 + uVar4);
  uVar5 = Abc_Lit2Var(iFan2);
  uVar4 = *(uint *)pAVar11;
  pAVar11->field_0x2 =
       (char)(((uint)bVar1 * 0x10000 + iVar6 & 0xff0000) + *(int *)(pAVar3 + uVar5) >> 0x10);
  pAVar11->iFan0 = (short)iFan0;
  pAVar11->iFan1 = (short)iFan1;
  pAVar11->iFan2 = (short)iFan2;
  if (p->fVerbose != 0) {
    uVar5 = Abc_Lit2Var(iFan0);
    iVar6 = Abc_LitIsCompl(iFan0);
    uVar7 = Abc_Lit2Var(iFan1);
    iVar8 = Abc_LitIsCompl(iFan1);
    uVar9 = Abc_Lit2Var(iFan2);
    iVar10 = Abc_LitIsCompl(iFan2);
    printf("Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c  iFan2 = %5d%c\n",
           (ulong)(uVar4 & 0xffff),0x6d,(ulong)uVar5,(ulong)(iVar6 * 2 + 0x2b),(ulong)uVar7,
           (ulong)(iVar8 * 2 + 0x2b),(ulong)uVar9,(ulong)(iVar10 * 2 + 0x2b));
  }
  Vec_IntPush(p->vRules3,iFan0);
  Vec_IntPush(p->vRules3,iFan1);
  Vec_IntPush(p->vRules3,iFan2);
  Vec_IntPush(p->vRules3,(uint)*(ushort *)pAVar11);
  return (int)*(ushort *)pAVar11;
}

Assistant:

int Amap_LibCreateMux( Amap_Lib_t * p, int iFan0, int iFan1, int iFan2 )
{
    Amap_Nod_t * pNode;
    pNode = Amap_LibCreateObj( p );
    pNode->Type  = AMAP_OBJ_MUX;
    pNode->nSuppSize = p->pNodes[Abc_Lit2Var(iFan0)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan1)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan2)].nSuppSize;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
    pNode->iFan2 = iFan2;
if ( p->fVerbose )
printf( "Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c  iFan2 = %5d%c\n", 
pNode->Id, 'm', 
Abc_Lit2Var(iFan0), (Abc_LitIsCompl(iFan0)?'-':'+'), 
Abc_Lit2Var(iFan1), (Abc_LitIsCompl(iFan1)?'-':'+'), 
Abc_Lit2Var(iFan2), (Abc_LitIsCompl(iFan2)?'-':'+') );

    Vec_IntPush( p->vRules3, iFan0 );
    Vec_IntPush( p->vRules3, iFan1 );
    Vec_IntPush( p->vRules3, iFan2 );
    Vec_IntPush( p->vRules3, pNode->Id );
    return pNode->Id;
}